

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

bool __thiscall llvm::detail::DoubleAPFloat::getExactInverse(DoubleAPFloat *this,APFloat *inv)

{
  bool bVar1;
  APFloat Inv;
  APFloat Tmp;
  APFloat local_a0;
  APFloat local_80;
  APInt local_60;
  Storage local_48;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt((DoubleAPFloat *)&local_a0);
    IEEEFloat::IEEEFloat
              (&local_80.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_a0);
    APInt::~APInt((APInt *)&local_a0);
    if (inv == (APFloat *)0x0) {
      bVar1 = APFloat::getExactInverse(&local_80,(APFloat *)0x0);
    }
    else {
      IEEEFloat::IEEEFloat(&local_a0.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy);
      bVar1 = APFloat::getExactInverse(&local_80,&local_a0);
      APFloat::bitcastToAPInt((APFloat *)&local_60);
      DoubleAPFloat((DoubleAPFloat *)&local_48.IEEE,(fltSemantics *)semPPCDoubleDouble,&local_60);
      APFloat::Storage::operator=((Storage *)&(inv->U).IEEE,&local_48);
      APFloat::Storage::~Storage((Storage *)&local_48.IEEE);
      APInt::~APInt(&local_60);
      APFloat::Storage::~Storage((Storage *)&local_a0.U.IEEE);
    }
    APFloat::Storage::~Storage((Storage *)&local_80.U.IEEE);
    return bVar1;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1123,"bool llvm::detail::DoubleAPFloat::getExactInverse(APFloat *) const");
}

Assistant:

bool DoubleAPFloat::getExactInverse(APFloat *inv) const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  if (!inv)
    return Tmp.getExactInverse(nullptr);
  APFloat Inv(semPPCDoubleDoubleLegacy);
  auto Ret = Tmp.getExactInverse(&Inv);
  *inv = APFloat(semPPCDoubleDouble, Inv.bitcastToAPInt());
  return Ret;
}